

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O3

PyObject * pybind11::detail::make_new_python_type(type_record *rec)

{
  ulong uVar1;
  bool bVar2;
  handle hVar3;
  int iVar4;
  object *poVar5;
  internals *piVar6;
  _Fwd_list_node_base *p_Var7;
  size_t sVar8;
  char *__dest;
  long lVar9;
  _heaptypeobject *p_Var10;
  handle *phVar11;
  ulong uVar12;
  error_already_set *this;
  long *plVar13;
  byte bVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  object *object;
  _heaptypeobject *p_Var16;
  PyObject *pPVar17;
  PyTypeObject *pPVar18;
  _typeobject *p_Var19;
  PyTypeObject *type;
  object module_;
  tuple bases;
  object name;
  object qualname;
  handle local_120;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  handle local_f8;
  allocator<char> local_e9;
  handle local_e8;
  handle local_e0;
  handle local_d8;
  handle local_d0;
  getattrfunc local_c8;
  PyObject local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  enable_if_t<_detail::is_pyobject<basic_string<char>_>::value_&&_detail::move_if_unreferenced<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
  local_90;
  allocator<char> local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_e8.m_ptr = (PyObject *)PyUnicode_FromString(rec->name);
  local_e0.m_ptr = local_e8.m_ptr;
  handle::inc_ref(&local_e0);
  pPVar17 = (rec->scope).m_ptr;
  if (pPVar17 == (PyObject *)0x0) {
    local_120.m_ptr = (PyObject *)0x0;
LAB_00127095:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_118,rec->name,(allocator<char> *)&local_d0);
    bVar2 = false;
  }
  else {
    if (pPVar17->ob_type != (PyTypeObject *)&PyModule_Type) {
      iVar4 = PyType_IsSubtype(pPVar17->ob_type,&PyModule_Type);
      pPVar17 = (rec->scope).m_ptr;
      if (iVar4 == 0) {
        iVar4 = PyObject_HasAttrString(pPVar17,"__qualname__");
        pPVar17 = (rec->scope).m_ptr;
        if (iVar4 == 1) {
          local_108._0_8_ = "__qualname__";
          local_108._8_8_ = (PyObject *)0x0;
          local_118._8_8_ = pPVar17;
          poVar5 = accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                             ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_118);
          local_d0.m_ptr =
               (PyObject *)PyUnicode_FromFormat("%U.%U",(poVar5->super_handle).m_ptr,local_e8.m_ptr)
          ;
          pybind11::object::operator=((object *)&local_e0,(object *)&local_d0);
          handle::dec_ref(&local_d0);
          handle::dec_ref((handle *)(local_108 + 8));
          pPVar17 = (rec->scope).m_ptr;
        }
      }
      local_120.m_ptr = (PyObject *)0x0;
      if (pPVar17 == (PyObject *)0x0) goto LAB_00127095;
    }
    local_120.m_ptr = (PyObject *)0x0;
    iVar4 = PyObject_HasAttrString(pPVar17,"__module__");
    if (iVar4 == 1) {
      local_118._8_8_ = (rec->scope).m_ptr;
      local_108._0_8_ = "__module__";
      local_108._8_8_ = (PyObject *)0x0;
      poVar5 = accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                         ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_118);
      local_d0.m_ptr = (poVar5->super_handle).m_ptr;
      handle::inc_ref(&local_d0);
      pybind11::object::operator=((object *)&local_120,(object *)&local_d0);
      handle::dec_ref(&local_d0);
      handle::dec_ref((handle *)(local_108 + 8));
    }
    else {
      iVar4 = PyObject_HasAttrString((rec->scope).m_ptr,"__name__");
      if (iVar4 == 1) {
        local_118._8_8_ = (rec->scope).m_ptr;
        local_108._0_8_ = "__name__";
        local_108._8_8_ = (PyObject *)0x0;
        poVar5 = accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                           ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_118);
        local_d0.m_ptr = (poVar5->super_handle).m_ptr;
        handle::inc_ref(&local_d0);
        pybind11::object::operator=((object *)&local_120,(object *)&local_d0);
        handle::dec_ref(&local_d0);
        handle::dec_ref((handle *)(local_108 + 8));
      }
    }
    if (local_120.m_ptr == (PyObject *)0x0) goto LAB_00127095;
    str::str((str *)&local_d8,(object *)&local_120);
    cast<std::__cxx11::string>(&local_90,(pybind11 *)&local_d8,object);
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_d0.m_ptr = &local_c0;
    pPVar17 = (PyObject *)(plVar13 + 2);
    if ((PyObject *)*plVar13 == pPVar17) {
      local_c0.ob_refcnt = pPVar17->ob_refcnt;
      local_c0.ob_type = (PyTypeObject *)plVar13[3];
    }
    else {
      local_c0.ob_refcnt = pPVar17->ob_refcnt;
      local_d0.m_ptr = (PyObject *)*plVar13;
    }
    local_c8 = (getattrfunc)plVar13[1];
    *plVar13 = (long)pPVar17;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_d0);
    local_118._0_8_ = local_108;
    p_Var16 = (_heaptypeobject *)(plVar13 + 2);
    if ((_heaptypeobject *)*plVar13 == p_Var16) {
      local_108._0_8_ = (p_Var16->ht_type).ob_base.ob_base.ob_refcnt;
      local_108._8_8_ = plVar13[3];
    }
    else {
      local_108._0_8_ = (p_Var16->ht_type).ob_base.ob_base.ob_refcnt;
      local_118._0_8_ = (_heaptypeobject *)*plVar13;
    }
    local_118._8_8_ = plVar13[1];
    *plVar13 = (long)p_Var16;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    bVar2 = true;
  }
  piVar6 = get_internals();
  p_Var7 = (_Fwd_list_node_base *)operator_new(0x28);
  p_Var7->_M_next = (_Fwd_list_node_base *)0x0;
  p_Var16 = (_heaptypeobject *)(p_Var7 + 3);
  p_Var7[1]._M_next = (_Fwd_list_node_base *)p_Var16;
  if ((_heaptypeobject *)local_118._0_8_ == (_heaptypeobject *)local_108) {
    (p_Var16->ht_type).ob_base.ob_base.ob_refcnt = local_108._0_8_;
    p_Var7[4]._M_next = (_Fwd_list_node_base *)local_108._8_8_;
  }
  else {
    p_Var7[1]._M_next = (_Fwd_list_node_base *)local_118._0_8_;
    p_Var7[3]._M_next = (_Fwd_list_node_base *)local_108._0_8_;
    p_Var16 = (_heaptypeobject *)local_118._0_8_;
  }
  p_Var7[2]._M_next = (_Fwd_list_node_base *)local_118._8_8_;
  local_118._8_8_ = (PyObject *)0x0;
  local_108._0_8_ = local_108._0_8_ & 0xffffffffffffff00;
  p_Var7->_M_next =
       (piVar6->static_strings).
       super__Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_head._M_next;
  (piVar6->static_strings).
  super__Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_head._M_next = p_Var7;
  local_118._0_8_ = (_heaptypeobject *)local_108;
  if (bVar2) {
    if (local_d0.m_ptr != &local_c0) {
      operator_delete(local_d0.m_ptr,(ulong)(local_c0.ob_refcnt + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    handle::dec_ref(&local_d8);
  }
  if ((rec->doc == (char *)0x0) || (options::global_state()::instance != '\x01')) {
    __dest = (char *)0x0;
  }
  else {
    sVar8 = strlen(rec->doc);
    __dest = (char *)PyObject_Malloc(sVar8 + 1);
    memcpy(__dest,rec->doc,sVar8 + 1);
  }
  piVar6 = get_internals();
  tuple::tuple((tuple *)&local_f8,&(rec->bases).super_object);
  lVar9 = PyTuple_Size(local_f8.m_ptr);
  if (lVar9 == 0) {
    p_Var19 = (_typeobject *)piVar6->instance_base;
  }
  else {
    local_118._8_8_ = local_f8.m_ptr;
    local_108._0_8_ = (key_type)0x0;
    local_108._8_8_ = (PyObject *)0x0;
    poVar5 = accessor<pybind11::detail::accessor_policies::tuple_item>::get_cache
                       ((accessor<pybind11::detail::accessor_policies::tuple_item> *)local_118);
    p_Var19 = (_typeobject *)(poVar5->super_handle).m_ptr;
    handle::dec_ref((handle *)(local_108 + 8));
  }
  pPVar18 = (PyTypeObject *)(rec->metaclass).m_ptr;
  if (pPVar18 == (PyTypeObject *)0x0) {
    pPVar18 = piVar6->default_metaclass;
  }
  p_Var10 = (_heaptypeobject *)(*pPVar18->tp_alloc)(pPVar18,0);
  hVar3.m_ptr = local_e8.m_ptr;
  if (p_Var10 == (_heaptypeobject *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,rec->name,local_70);
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_b0);
    local_118._0_8_ = *plVar13;
    p_Var16 = (_heaptypeobject *)(plVar13 + 2);
    if ((_heaptypeobject *)local_118._0_8_ == p_Var16) {
      local_108._0_8_ = (p_Var16->ht_type).ob_base.ob_base.ob_refcnt;
      local_108._8_8_ = plVar13[3];
      local_118._0_8_ = (_heaptypeobject *)local_108;
    }
    else {
      local_108._0_8_ = (p_Var16->ht_type).ob_base.ob_base.ob_refcnt;
    }
    local_118._8_8_ = plVar13[1];
    *plVar13 = (long)p_Var16;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    pybind11_fail((string *)local_118);
  }
  local_e8.m_ptr = (PyObject *)0x0;
  p_Var10->ht_name = hVar3.m_ptr;
  phVar11 = handle::inc_ref(&local_e0);
  p_Var10->ht_qualname = phVar11->m_ptr;
  (p_Var10->ht_type).tp_name = (char *)p_Var16;
  (p_Var10->ht_type).tp_doc = __dest;
  (p_Var19->ob_base).ob_base.ob_refcnt = (p_Var19->ob_base).ob_base.ob_refcnt + 1;
  (p_Var10->ht_type).tp_base = p_Var19;
  (p_Var10->ht_type).tp_basicsize = 0x38;
  lVar9 = PyTuple_Size(local_f8.m_ptr);
  hVar3.m_ptr = local_f8.m_ptr;
  if (lVar9 != 0) {
    local_f8.m_ptr = (PyObject *)0x0;
    (p_Var10->ht_type).tp_bases = hVar3.m_ptr;
  }
  (p_Var10->ht_type).tp_init = pybind11_object_init;
  (p_Var10->ht_type).tp_as_number = &p_Var10->as_number;
  (p_Var10->ht_type).tp_as_sequence = &p_Var10->as_sequence;
  (p_Var10->ht_type).tp_as_mapping = &p_Var10->as_mapping;
  (p_Var10->ht_type).tp_as_async = &p_Var10->as_async;
  uVar1 = (p_Var10->ht_type).tp_flags;
  uVar12 = uVar1 | 0x200;
  (p_Var10->ht_type).tp_flags = uVar12;
  bVar14 = rec->field_0x80;
  if ((bVar14 & 0x20) == 0) {
    uVar12 = uVar1 | 0x600;
    (p_Var10->ht_type).tp_flags = uVar12;
    bVar14 = rec->field_0x80;
  }
  if ((bVar14 & 2) != 0) {
    (p_Var10->ht_type).tp_flags = uVar12 | 0x4000;
    lVar9 = (p_Var10->ht_type).tp_basicsize;
    (p_Var10->ht_type).tp_dictoffset = lVar9;
    (p_Var10->ht_type).tp_basicsize = lVar9 + 8;
    (p_Var10->ht_type).tp_traverse = pybind11_traverse;
    (p_Var10->ht_type).tp_clear = pybind11_clear;
    (p_Var10->ht_type).tp_getset =
         (PyGetSetDef *)enable_dynamic_attributes(_heaptypeobject*)::getset;
    bVar14 = rec->field_0x80;
  }
  if ((bVar14 & 4) != 0) {
    (p_Var10->ht_type).tp_as_buffer = &p_Var10->as_buffer;
    (p_Var10->as_buffer).bf_getbuffer = pybind11_getbuffer;
    (p_Var10->as_buffer).bf_releasebuffer = pybind11_releasebuffer;
  }
  if ((rec->custom_type_setup_callback).super__Function_base._M_manager != (_Manager_type)0x0) {
    local_118._0_8_ = p_Var10;
    (*(rec->custom_type_setup_callback)._M_invoker)
              ((_Any_data *)&rec->custom_type_setup_callback,(_heaptypeobject **)local_118);
  }
  iVar4 = PyType_Ready(p_Var10);
  if (iVar4 < 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_70,rec->name,&local_e9);
    plVar13 = (long *)std::__cxx11::string::append((char *)local_70);
    local_b0._M_dataplus._M_p = (pointer)*plVar13;
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == paVar15) {
      local_b0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_b0.field_2._8_8_ = plVar13[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
    }
    local_b0._M_string_length = plVar13[1];
    *plVar13 = (long)paVar15;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    error_string_abi_cxx11_();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                   &local_b0,&local_50);
    pybind11_fail((string *)local_118);
  }
  if (((rec->field_0x80 & 2) != 0) && (((p_Var10->ht_type).tp_flags & 0x4000) == 0)) {
    __assert_fail("!rec.dynamic_attr || PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC)",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/pybind11/include/pybind11/detail/class.h"
                  ,0x2df,"PyObject *pybind11::detail::make_new_python_type(const type_record &)");
  }
  pPVar17 = (rec->scope).m_ptr;
  if (pPVar17 == (PyObject *)0x0) {
    (p_Var10->ht_type).ob_base.ob_base.ob_refcnt = (p_Var10->ht_type).ob_base.ob_base.ob_refcnt + 1;
  }
  else {
    iVar4 = PyObject_SetAttrString(pPVar17,rec->name,p_Var10);
    if (iVar4 != 0) {
      this = (error_already_set *)__cxa_allocate_exception(0x18);
      error_already_set::error_already_set(this);
      goto LAB_00127590;
    }
  }
  if ((local_120.m_ptr == (PyObject *)0x0) ||
     (iVar4 = PyObject_SetAttrString(p_Var10,"__module__"), iVar4 == 0)) {
    handle::dec_ref(&local_f8);
    handle::dec_ref(&local_120);
    handle::dec_ref(&local_e0);
    handle::dec_ref(&local_e8);
    return (PyObject *)p_Var10;
  }
  this = (error_already_set *)__cxa_allocate_exception(0x18);
  error_already_set::error_already_set(this);
LAB_00127590:
  __cxa_throw(this,&error_already_set::typeinfo,error_already_set::~error_already_set);
}

Assistant:

inline PyObject *make_new_python_type(const type_record &rec) {
    auto name = reinterpret_steal<object>(PYBIND11_FROM_STRING(rec.name));

    auto qualname = name;
    if (rec.scope && !PyModule_Check(rec.scope.ptr()) && hasattr(rec.scope, "__qualname__")) {
        qualname = reinterpret_steal<object>(
            PyUnicode_FromFormat("%U.%U", rec.scope.attr("__qualname__").ptr(), name.ptr()));
    }

    object module_;
    if (rec.scope) {
        if (hasattr(rec.scope, "__module__")) {
            module_ = rec.scope.attr("__module__");
        } else if (hasattr(rec.scope, "__name__")) {
            module_ = rec.scope.attr("__name__");
        }
    }

    const auto *full_name = c_str(
#if !defined(PYPY_VERSION)
        module_ ? str(module_).cast<std::string>() + "." + rec.name :
#endif
                rec.name);

    char *tp_doc = nullptr;
    if (rec.doc && options::show_user_defined_docstrings()) {
        /* Allocate memory for docstring (Python will free this later on) */
        size_t size = std::strlen(rec.doc) + 1;
#if PY_VERSION_HEX >= 0x030D0000
        tp_doc = (char *) PyMem_MALLOC(size);
#else
        tp_doc = (char *) PyObject_MALLOC(size);
#endif
        std::memcpy((void *) tp_doc, rec.doc, size);
    }

    auto &internals = get_internals();
    auto bases = tuple(rec.bases);
    auto *base = (bases.empty()) ? internals.instance_base : bases[0].ptr();

    /* Danger zone: from now (and until PyType_Ready), make sure to
       issue no Python C API calls which could potentially invoke the
       garbage collector (the GC will call type_traverse(), which will in
       turn find the newly constructed type in an invalid state) */
    auto *metaclass
        = rec.metaclass.ptr() ? (PyTypeObject *) rec.metaclass.ptr() : internals.default_metaclass;

    auto *heap_type = (PyHeapTypeObject *) metaclass->tp_alloc(metaclass, 0);
    if (!heap_type) {
        pybind11_fail(std::string(rec.name) + ": Unable to create type object!");
    }

    heap_type->ht_name = name.release().ptr();
#ifdef PYBIND11_BUILTIN_QUALNAME
    heap_type->ht_qualname = qualname.inc_ref().ptr();
#endif

    auto *type = &heap_type->ht_type;
    type->tp_name = full_name;
    type->tp_doc = tp_doc;
    type->tp_base = type_incref((PyTypeObject *) base);
    type->tp_basicsize = static_cast<ssize_t>(sizeof(instance));
    if (!bases.empty()) {
        type->tp_bases = bases.release().ptr();
    }

    /* Don't inherit base __init__ */
    type->tp_init = pybind11_object_init;

    /* Supported protocols */
    type->tp_as_number = &heap_type->as_number;
    type->tp_as_sequence = &heap_type->as_sequence;
    type->tp_as_mapping = &heap_type->as_mapping;
    type->tp_as_async = &heap_type->as_async;

    /* Flags */
    type->tp_flags |= Py_TPFLAGS_DEFAULT | Py_TPFLAGS_HEAPTYPE;
    if (!rec.is_final) {
        type->tp_flags |= Py_TPFLAGS_BASETYPE;
    }

    if (rec.dynamic_attr) {
        enable_dynamic_attributes(heap_type);
    }

    if (rec.buffer_protocol) {
        enable_buffer_protocol(heap_type);
    }

    if (rec.custom_type_setup_callback) {
        rec.custom_type_setup_callback(heap_type);
    }

    if (PyType_Ready(type) < 0) {
        pybind11_fail(std::string(rec.name) + ": PyType_Ready failed: " + error_string());
    }

    assert(!rec.dynamic_attr || PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC));

    /* Register type with the parent scope */
    if (rec.scope) {
        setattr(rec.scope, rec.name, (PyObject *) type);
    } else {
        Py_INCREF(type); // Keep it alive forever (reference leak)
    }

    if (module_) { // Needed by pydoc
        setattr((PyObject *) type, "__module__", module_);
    }

    PYBIND11_SET_OLDPY_QUALNAME(type, qualname);

    return (PyObject *) type;
}